

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3Field
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  bool bVar1;
  CppType CVar2;
  Syntax SVar3;
  Type TVar4;
  Descriptor *this_00;
  EnumDescriptor *pEVar5;
  FileDescriptor *this_01;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  FieldDescriptor *in_RDX;
  FieldDescriptor *in_RSI;
  string *in_RDI;
  string *unaff_retaddr;
  ErrorLocation in_stack_0000000c;
  Message *in_stack_00000010;
  string *in_stack_00000018;
  DescriptorBuilder *in_stack_00000020;
  FieldDescriptor *in_stack_ffffffffffffff30;
  FieldDescriptor *in_stack_ffffffffffffff40;
  string local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  string local_78 [8];
  char *in_stack_ffffffffffffff90;
  ErrorLocation in_stack_ffffffffffffff9c;
  Message *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  DescriptorBuilder *in_stack_ffffffffffffffb0;
  string local_38 [32];
  FieldDescriptor *local_18;
  FieldDescriptor *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = FieldDescriptor::is_extension(in_RSI);
  if (bVar1) {
    this_00 = FieldDescriptor::containing_type(local_10);
    Descriptor::full_name_abi_cxx11_(this_00);
    bVar1 = anon_unknown_1::AllowedExtendeeInProto3(in_RDI);
    if (!bVar1) {
      FieldDescriptor::full_name_abi_cxx11_(local_10);
      AddError(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
    }
  }
  bVar1 = FieldDescriptor::is_required((FieldDescriptor *)0x4c8bfb);
  if (bVar1) {
    FieldDescriptor::full_name_abi_cxx11_(local_10);
    AddError(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
  }
  bVar1 = FieldDescriptor::has_default_value(local_10);
  if (bVar1) {
    FieldDescriptor::full_name_abi_cxx11_(local_10);
    AddError(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
  }
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4c8c7d);
  if ((CVar2 == CPPTYPE_ENUM) &&
     (pEVar5 = FieldDescriptor::enum_type(in_stack_ffffffffffffff30),
     pEVar5 != (EnumDescriptor *)0x0)) {
    pEVar5 = FieldDescriptor::enum_type(in_stack_ffffffffffffff30);
    this_01 = EnumDescriptor::file(pEVar5);
    SVar3 = FileDescriptor::syntax(this_01);
    if (SVar3 != SYNTAX_PROTO3) {
      __lhs = FieldDescriptor::full_name_abi_cxx11_(local_10);
      pEVar5 = FieldDescriptor::enum_type(in_stack_ffffffffffffff30);
      EnumDescriptor::full_name_abi_cxx11_(pEVar5);
      std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffff30);
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              FieldDescriptor::containing_type(local_10);
      Descriptor::full_name_abi_cxx11_((Descriptor *)__rhs);
      std::operator+(__lhs,__rhs);
      std::operator+(__lhs,(char *)__rhs);
      AddError(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c,unaff_retaddr
              );
      std::__cxx11::string::~string(local_38);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string(local_98);
      in_stack_ffffffffffffff40 = local_18;
    }
  }
  TVar4 = FieldDescriptor::type(in_stack_ffffffffffffff40);
  if (TVar4 == TYPE_GROUP) {
    FieldDescriptor::full_name_abi_cxx11_(local_10);
    AddError(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3Field(FieldDescriptor* field,
                                            const FieldDescriptorProto& proto) {
  if (field->is_extension() &&
      !AllowedExtendeeInProto3(field->containing_type()->full_name())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions in proto3 are only allowed for defining options.");
  }
  if (field->is_required()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Required fields are not allowed in proto3.");
  }
  if (field->has_default_value()) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Explicit default values are not allowed in proto3.");
  }
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
      field->enum_type() &&
      field->enum_type()->file()->syntax() != FileDescriptor::SYNTAX_PROTO3) {
    // Proto3 messages can only use Proto3 enum types; otherwise we can't
    // guarantee that the default value is zero.
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Enum type \"" + field->enum_type()->full_name() +
                 "\" is not a proto3 enum, but is used in \"" +
                 field->containing_type()->full_name() +
                 "\" which is a proto3 message type.");
  }
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Groups are not supported in proto3 syntax.");
  }
}